

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Term.cpp
# Opt level: O3

void __thiscall Kernel::Term::Term(Term *this)

{
  this->_vptr_Term = (_func_int **)&PTR_computable_00b3d668;
  *(undefined8 *)&this->_functor = 0;
  this->_weight = 0;
  this->_kboWeight = -1;
  this->_maxRedLen = 0;
  (this->field_9)._vars = 0;
  this->_args[0]._content = 0xfffffc02;
  return;
}

Assistant:

Term::Term() throw()
  :_functor(0),
   _arity(0),
   _color(COLOR_TRANSPARENT),
   _hasInterpretedConstants(0),
   _isTwoVarEquality(0),
   _weight(0),
   _kboWeight(-1),
#if VDEBUG
   _kboInstance(nullptr),
#endif
   _maxRedLen(0),
   _vars(0)
{
  _args[0].setContent(0);
  _args[0]._setTag(FUN);
  _args[0]._setDistinctVars(TERM_DIST_VAR_UNKNOWN);
}